

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall
mkvparser::AudioTrack::AudioTrack
          (AudioTrack *this,Segment *pSegment,longlong element_start,longlong element_size)

{
  undefined8 *in_RDI;
  longlong unaff_retaddr;
  
  Track::Track((Track *)element_start,(Segment *)element_size,unaff_retaddr,(longlong)in_RDI);
  *in_RDI = &PTR__AudioTrack_00c92a58;
  return;
}

Assistant:

AudioTrack::AudioTrack(Segment* pSegment, long long element_start,
                       long long element_size)
    : Track(pSegment, element_start, element_size) {}